

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestCase::~TestCase(TestCase *this)

{
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_00136688;
  internal::
  ForEach<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,void(*)(testing::TestInfo*)>
            (&this->test_info_list_,internal::Delete<testing::TestInfo>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::~_Vector_base
            (&(this->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&this->type_param_);
  internal::String::~String(&this->name_);
  return;
}

Assistant:

TestCase::~TestCase() {
  // Deletes every Test in the collection.
  ForEach(test_info_list_, internal::Delete<TestInfo>);
}